

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notifier.hpp
# Opt level: O2

void __thiscall tf::Notifier::notify(Notifier *this,bool all)

{
  pointer pWVar1;
  __base_type _Var2;
  long lVar3;
  ulong uVar4;
  Waiter *waiters;
  ulong uVar5;
  __int_type_conflict _Var6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar5 = (this->_state).super___atomic_base<unsigned_long>._M_i;
  do {
    if ((int)uVar5 == 0xffff) {
      return;
    }
    uVar8 = uVar5 & 0xffff;
    uVar7 = uVar5 >> 0x10 & 0xffff;
    if (all) {
      _Var6 = (uVar7 << 0x20) + (uVar5 & 0xffffffff00000000) + 0xffff;
    }
    else if (uVar7 == 0) {
      pWVar1 = (this->_waiters).
               super__Vector_base<tf::Notifier::Waiter,_std::allocator<tf::Notifier::Waiter>_>.
               _M_impl.super__Vector_impl_data._M_start;
      _Var2._M_p = pWVar1[uVar8].next._M_b._M_p;
      if (_Var2._M_p == (__pointer_type)0x0) {
        lVar3 = 0xffff;
      }
      else {
        lVar3 = ((long)_Var2._M_p - (long)pWVar1) / 0x70;
      }
      _Var6 = (uVar5 & 0xffffffff00000000) + lVar3;
    }
    else {
      _Var6 = uVar5 + 0xffff0000;
    }
    LOCK();
    uVar4 = (this->_state).super___atomic_base<unsigned_long>._M_i;
    bVar9 = uVar5 == uVar4;
    if (bVar9) {
      (this->_state).super___atomic_base<unsigned_long>._M_i = _Var6;
      uVar4 = uVar5;
    }
    UNLOCK();
    uVar5 = uVar4;
  } while (!bVar9);
  if ((int)uVar8 == 0xffff || !all && uVar7 != 0) {
    return;
  }
  waiters = (this->_waiters).
            super__Vector_base<tf::Notifier::Waiter,_std::allocator<tf::Notifier::Waiter>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  if (!all) {
    (waiters->next)._M_b._M_p = (__pointer_type)0x0;
  }
  _unpark(this,waiters);
  return;
}

Assistant:

void notify(bool all) {
    std::atomic_thread_fence(std::memory_order_seq_cst);
    uint64_t state = _state.load(std::memory_order_acquire);
    for (;;) {
      // Easy case: no waiters.
      if ((state & kStackMask) == kStackMask && (state & kWaiterMask) == 0)
        return;
      uint64_t waiters = (state & kWaiterMask) >> kWaiterShift;
      uint64_t newstate;
      if (all) {
        // Reset prewait counter and empty wait list.
        newstate = (state & kEpochMask) + (kEpochInc * waiters) + kStackMask;
      } else if (waiters) {
        // There is a thread in pre-wait state, unblock it.
        newstate = state + kEpochInc - kWaiterInc;
      } else {
        // Pop a waiter from list and unpark it.
        Waiter* w = &_waiters[state & kStackMask];
        Waiter* wnext = w->next.load(std::memory_order_relaxed);
        uint64_t next = kStackMask;
        //if (wnext != nullptr) next = wnext - &_waiters[0];
        if (wnext != nullptr) next = static_cast<uint64_t>(wnext - &_waiters[0]);
        // Note: we don't add kEpochInc here. ABA problem on the lock-free stack
        // can't happen because a waiter is re-pushed onto the stack only after
        // it was in the pre-wait state which inevitably leads to epoch
        // increment.
        newstate = (state & kEpochMask) + next;
      }
      if (_state.compare_exchange_weak(state, newstate,
                                       std::memory_order_acquire)) {
        if (!all && waiters) return;  // unblocked pre-wait thread
        if ((state & kStackMask) == kStackMask) return;
        Waiter* w = &_waiters[state & kStackMask];
        if (!all) w->next.store(nullptr, std::memory_order_relaxed);
        _unpark(w);
        return;
      }
    }
  }